

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O1

ssize_t __thiscall bsplib::Unbuf::recv(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer *ppEVar1;
  iterator __position;
  exception *this_00;
  ulong uVar2;
  Entry entry;
  undefined1 local_1b8 [16];
  size_t local_1a8;
  uint uStack_1a0;
  undefined4 uStack_19c;
  
  __position._M_current =
       (this->m_recvs).
       super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->m_recvs).
                super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar2 & 0xffffffff80000000) == 0) {
    uStack_1a0 = (int)uVar2 * 2 + 1;
    if (__position._M_current ==
        (this->m_recvs).
        super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_1b8._0_4_ = __fd;
      local_1b8._8_8_ = __buf;
      local_1a8 = __n;
      std::vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>>::
      _M_realloc_insert<bsplib::Unbuf::Entry_const&>
                ((vector<bsplib::Unbuf::Entry,std::allocator<bsplib::Unbuf::Entry>> *)&this->m_recvs
                 ,__position,(Entry *)local_1b8);
    }
    else {
      (__position._M_current)->size = __n;
      *(ulong *)&(__position._M_current)->tag = CONCAT44(uStack_19c,uStack_1a0);
      *(ulong *)__position._M_current = CONCAT44(local_1b8._4_4_,__fd);
      (__position._M_current)->addr = (char *)__buf;
      ppEVar1 = &(this->m_recvs).
                 super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    return (ulong)uStack_1a0;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x1a0);
  exception::exception((exception *)local_1b8,"bsp_hpput");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 8),"Too many HP messages",0x14);
  exception::exception(this_00,(exception *)local_1b8);
  __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
}

Assistant:

int Unbuf :: recv( int src_pid, void * addr, size_t size )
{
    size_t int_max = std::numeric_limits<int>::max();
    if ( m_recvs.size() > int_max )
        throw exception("bsp_hpput") << "Too many HP messages";
 
    Entry entry = { src_pid, 
                    static_cast<char *>(addr),
                    size,
                    int (2* m_recvs.size() + 1) };
    m_recvs.push_back( entry );
    return entry.tag;
}